

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cc
# Opt level: O2

string * __thiscall
kratos::SystemVerilogCodeGen::get_port_str_abi_cxx11_
          (string *__return_storage_ptr__,SystemVerilogCodeGen *this,Port *port)

{
  uint *puVar1;
  undefined1 this_00 [8];
  pointer begin;
  int iVar2;
  long *plVar3;
  long lVar4;
  Var *pVVar5;
  InternalException *this_01;
  PortDirection direction;
  Var *var;
  Var *var_00;
  Var *var_01;
  string *in_R8;
  undefined1 auStack_68 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  strs;
  undefined1 local_48 [8];
  string str;
  
  auStack_68 = (undefined1  [8])0x0;
  strs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  strs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)auStack_68,8);
  port_dir_to_str_abi_cxx11_
            ((string *)local_48,(kratos *)(ulong)*(uint *)&(this->stream_).field_0x188,direction);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)auStack_68,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
  std::__cxx11::string::~string((string *)local_48);
  iVar2 = (*this->_vptr_SystemVerilogCodeGen[0x17])(this);
  if ((char)iVar2 == '\0') {
    iVar2 = (*this->_vptr_SystemVerilogCodeGen[0x1a])(this);
    if (((char)iVar2 != '\0') || (*(long *)&(this->stream_).super_stringstream.field_0x108 != 0))
    goto LAB_0018f8b0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[6]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)auStack_68,
               (char (*) [6])0x2259ef);
  }
  else {
LAB_0018f8b0:
    iVar2 = (*this->_vptr_SystemVerilogCodeGen[0x1a])(this);
    if ((char)iVar2 == '\0') {
      plVar3 = *(long **)&(this->stream_).super_stringstream.field_0x108;
      if (plVar3 == (long *)0x0) {
        (*this->_vptr_SystemVerilogCodeGen[0x2e])(local_48,this);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string&>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)auStack_68,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&str);
      }
      else {
        (**(code **)(*plVar3 + 0xf8))(local_48);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)auStack_68,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
        std::__cxx11::string::~string((string *)local_48);
      }
    }
    else {
      plVar3 = (long *)__dynamic_cast(this,&Port::typeinfo,&EnumPort::typeinfo,0);
      if (plVar3 == (long *)0x0) {
        this_01 = (InternalException *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_48,"Unable to convert port to enum_def",
                   (allocator<char> *)(str.field_2._M_local_buf + 0xf));
        InternalException::InternalException(this_01,(string *)local_48);
        __cxa_throw(this_01,&InternalException::typeinfo,std::runtime_error::~runtime_error);
      }
      lVar4 = (**(code **)(*plVar3 + 0x160))(plVar3);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string_const&>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)auStack_68,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(lVar4 + 0x40)
                );
    }
  }
  if ((this->stream_).super_stringstream.field_0x8 == '\x01') {
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[7]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)auStack_68,
               (char (*) [7])0x21f0e5);
  }
  puVar1 = (uint *)(this->options_).package_name._M_string_length;
  if (((*puVar1 < 2) &&
      ((this->options_).package_name.field_2._M_allocated_capacity - (long)puVar1 < 5)) &&
     ((this->stream_).super_stringstream.field_0xf8 == '\0')) {
    pVVar5 = Var::get_size_param((Var *)this,0);
    if (pVVar5 != (Var *)0x0) goto LAB_0018f9b7;
  }
  else {
LAB_0018f9b7:
    iVar2 = (*this->_vptr_SystemVerilogCodeGen[0x18])(this);
    if ((char)iVar2 != '\0') {
      get_var_size_str_abi_cxx11_((string *)local_48,(kratos *)this,var);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string&>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)auStack_68,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
      std::__cxx11::string::~string((string *)local_48);
    }
  }
  iVar2 = (*this->_vptr_SystemVerilogCodeGen[0x17])(this);
  if ((char)iVar2 == '\0') {
    iVar2 = (*this->_vptr_SystemVerilogCodeGen[0x1a])(this);
    if (((char)iVar2 == '\0') && (*(long *)&(this->stream_).super_stringstream.field_0x108 == 0)) {
      get_var_width_str_abi_cxx11_((string *)local_48,this,var_00);
      if (str._M_dataplus._M_p != (pointer)0x0) {
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string_const&>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)auStack_68,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
      }
      std::__cxx11::string::~string((string *)local_48);
    }
  }
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string&>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)auStack_68,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &(this->label_index_)._M_h._M_rehash_policy);
  puVar1 = (uint *)(this->options_).package_name._M_string_length;
  if (((*puVar1 < 2) &&
      ((this->options_).package_name.field_2._M_allocated_capacity - (long)puVar1 < 5)) &&
     ((this->stream_).super_stringstream.field_0xf8 == '\0')) {
    pVVar5 = Var::get_size_param((Var *)this,0);
    if (pVVar5 == (Var *)0x0) goto LAB_0018fab0;
  }
  iVar2 = (*this->_vptr_SystemVerilogCodeGen[0x18])(this);
  if ((char)iVar2 == '\0') {
    get_var_size_str_abi_cxx11_((string *)local_48,(kratos *)this,var_01);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string&>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)auStack_68,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
    std::__cxx11::string::~string((string *)local_48);
  }
LAB_0018fab0:
  begin = strs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
  this_00 = auStack_68;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_48," ",(allocator<char> *)(str.field_2._M_local_buf + 0xf));
  string::
  join<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            (__return_storage_ptr__,(string *)this_00,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )begin,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
             in_R8);
  std::__cxx11::string::~string((string *)local_48);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)auStack_68);
  return __return_storage_ptr__;
}

Assistant:

std::string SystemVerilogCodeGen::get_port_str(Port* port) {
    std::vector<std::string> strs;
    strs.reserve(8);
    strs.emplace_back(port_dir_to_str(port->port_direction()));
    // we use logic for all inputs and outputs
    if (!port->is_struct() && !port->is_enum() && !port->raw_type_parametrized()) {
        strs.emplace_back("logic");
    } else if (port->is_enum()) {
        auto* enum_def = dynamic_cast<EnumPort*>(port);
        if (!enum_def) throw InternalException("Unable to convert port to enum_def");
        strs.emplace_back(enum_def->enum_type()->name);
    } else if (port->raw_type_parametrized()) {
        auto* p = port->get_raw_type_param();
        strs.emplace_back(p->to_string());
    } else {
        auto* ptr = reinterpret_cast<PortPackedStruct*>(port);
        strs.emplace_back(ptr->packed_struct()->struct_name);
    }
    if (port->is_signed()) strs.emplace_back("signed");
    if ((port->size().front() > 1 || port->size().size() > 1 || port->explicit_array() ||
         port->get_size_param(0)) &&
        port->is_packed()) {
        auto str = get_var_size_str(port);
        strs.emplace_back(str);
    }
    if (!port->is_struct() && !port->is_enum() && !port->raw_type_parametrized()) {
        auto const& var_width_str = get_var_width_str(port);
        if (!var_width_str.empty()) strs.emplace_back(var_width_str);
    }
    strs.emplace_back(port->name);

    if ((port->size().front() > 1 || port->size().size() > 1 || port->explicit_array() ||
         port->get_size_param(0)) &&
        !port->is_packed()) {
        auto str = get_var_size_str(port);
        strs.emplace_back(str);
    }
    return string::join(strs.begin(), strs.end(), " ");
}